

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

void __thiscall Assimp::ColladaExporter::WriteFile(ColladaExporter *this)

{
  undefined1 *puVar1;
  ostream *poVar2;
  long *plVar3;
  long *plVar4;
  allocator local_a9;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  string local_48;
  
  puVar1 = &this->field_0x38;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,"<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"no\" ?>",0x37)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,
             "<COLLADA xmlns=\"http://www.collada.org/2005/11/COLLADASchema\" version=\"1.4.1\">",
             0x4e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)&this->startstr);
  WriteTextures(this);
  WriteHeader(this);
  WriteCamerasLibrary(this);
  WriteLightsLibrary(this);
  WriteMaterials(this);
  WriteGeometryLibrary(this);
  WriteControllerLibrary(this);
  WriteSceneLibrary(this);
  WriteAnimationsLibrary(this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<scene>",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)&this->startstr);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__cxx11::string::string((string *)&local_48,(this->mScene->mRootNode->mName).data,&local_a9);
  XMLEscape(&local_68,&local_48);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x6bf1ac);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_78 = *plVar4;
    lStack_70 = plVar3[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar4;
    local_88 = (long *)*plVar3;
  }
  local_80 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_98 = *plVar4;
    lStack_90 = plVar3[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar4;
    local_a8 = (long *)*plVar3;
  }
  local_a0 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_a8,local_a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  PopTag(this);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</scene>",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  PopTag(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"</COLLADA>",10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  return;
}

Assistant:

void ColladaExporter::WriteFile() {
    // write the DTD
    mOutput << "<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"no\" ?>" << endstr;
    // COLLADA element start
    mOutput << "<COLLADA xmlns=\"http://www.collada.org/2005/11/COLLADASchema\" version=\"1.4.1\">" << endstr;
    PushTag();

    WriteTextures();
    WriteHeader();

    WriteCamerasLibrary();
    WriteLightsLibrary();
    WriteMaterials();
    WriteGeometryLibrary();
    WriteControllerLibrary();

    WriteSceneLibrary();
	
	// customized, Writes the animation library
	WriteAnimationsLibrary();

    // useless Collada fu at the end, just in case we haven't had enough indirections, yet.
    mOutput << startstr << "<scene>" << endstr;
    PushTag();
    mOutput << startstr << "<instance_visual_scene url=\"#" + XMLEscape(mScene->mRootNode->mName.C_Str()) + "\" />" << endstr;
    PopTag();
    mOutput << startstr << "</scene>" << endstr;
    PopTag();
    mOutput << "</COLLADA>" << endstr;
}